

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

TcParseTableBase * __thiscall google::protobuf::Reflection::CreateTcParseTable(Reflection *this)

{
  Descriptor *descriptor;
  Nullable<const_char_*> pcVar1;
  uint16_t lookup_table_offset_00;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  CppType CVar6;
  uint32_t uVar7;
  iterator iVar8;
  iterator iVar9;
  char *pcVar10;
  LogMessage *pLVar11;
  size_type sVar12;
  size_type sVar13;
  TcParseTableBase *this_00;
  reference pvVar14;
  undefined4 extraout_var;
  TailCallParseFunc fallback;
  FastFieldEntry *fast_entries;
  uint16_t *lookup_table;
  FieldEntry *entries;
  FieldAux *field_aux;
  uchar *__src;
  uint32_t local_2b8;
  uint16_t local_2b2;
  uint16_t local_2a8;
  bool local_229;
  uint32_t local_218;
  LogMessage local_1c8;
  Voidify local_1b5;
  int local_1b4;
  long local_1b0;
  Nullable<const_char_*> local_1a8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  TcParseTableBase *res;
  void *p;
  int byte_size;
  uint32_t aux_offset;
  uint32_t field_entry_offset;
  uint16_t lookup_table_offset;
  Voidify local_169;
  Nullable<const_char_*> local_168;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t fast_entries_count;
  MessageOptions local_142;
  undefined1 local_140 [8];
  TailCallTableInfo table_info;
  value_type local_98;
  byte local_71;
  FieldDescriptor *pFStack_70;
  bool is_inlined;
  FieldDescriptor *field;
  int i;
  undefined1 local_58 [8];
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  fields;
  int kNoHasbit;
  Reflection *this_local;
  
  fields.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::vector((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
            *)local_58);
  iVar4 = Descriptor::field_count(this->descriptor_);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::reserve((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             *)local_58,(long)iVar4);
  field._0_4_ = 0;
  while( true ) {
    iVar4 = (int)field;
    iVar5 = Descriptor::field_count(this->descriptor_);
    if (iVar5 <= iVar4) break;
    pFStack_70 = Descriptor::field(this->descriptor_,(int)field);
    local_71 = IsInlined(this,pFStack_70);
    local_98.field = pFStack_70;
    local_98.has_bit_index = internal::ReflectionSchema::HasBitIndex(&this->schema_,pFStack_70);
    local_98.presence_probability = 1.0;
    local_98.lazy_opt = GetLazyStyle(this,pFStack_70);
    local_98.is_string_inlined = (bool)(local_71 & 1);
    local_98.is_implicitly_weak = false;
    local_98.use_direct_tcparser_table = false;
    local_98.should_split = internal::ReflectionSchema::IsSplit(&this->schema_,pFStack_70);
    if ((local_71 & 1) == 0) {
      local_218 = 0xffffffff;
    }
    else {
      local_218 = internal::ReflectionSchema::InlinedStringIndex(&this->schema_,pFStack_70);
    }
    local_98.inlined_string_index = local_218;
    CVar6 = FieldDescriptor::cpp_type(pFStack_70);
    local_229 = false;
    if (CVar6 == CPPTYPE_STRING) {
      local_229 = IsMicroString(this,pFStack_70);
    }
    local_98.use_micro_string = local_229;
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
    ::push_back((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                 *)local_58,&local_98);
    field._0_4_ = (int)field + 1;
  }
  iVar8 = std::
          vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          ::begin((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   *)local_58);
  iVar9 = std::
          vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          ::end((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                 *)local_58);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,google::protobuf::Reflection::CreateTcParseTable()const::__0>
            (iVar8._M_current,iVar9._M_current);
  descriptor = this->descriptor_;
  local_142.is_lite = false;
  local_142.uses_codegen = false;
  absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const>::
  Span<std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>,void,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>,int>
            ((Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const> *)
             &fast_entries_count,
             (vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
              *)local_58);
  internal::TailCallTableInfo::TailCallTableInfo
            ((TailCallTableInfo *)local_140,descriptor,&local_142,_fast_entries_count);
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)
       std::
       vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
       ::size((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
               *)&table_info);
  iVar4 = absl::lts_20250127::log_internal::GetReferenceableValue
                    ((int)absl_log_internal_check_op_result);
  iVar5 = absl::lts_20250127::log_internal::GetReferenceableValue
                    (1 << ((byte)table_info.field_name_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage & 0x1f));
  local_168 = absl::lts_20250127::log_internal::Check_EQImpl
                        (iVar4,iVar5,
                         "static_cast<int>(fast_entries_count) == 1 << table_info.table_size_log2");
  if (local_168 != (Nullable<const_char_*>)0x0) {
    pcVar10 = absl::lts_20250127::implicit_cast<char_const*>(local_168);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&field_entry_offset,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xe44,pcVar10);
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                        ((LogMessage *)&field_entry_offset);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_169,pLVar11);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&field_entry_offset);
  }
  uVar7 = AlignTo<unsigned_short>((int)absl_log_internal_check_op_result * 0x10 + 0x38);
  aux_offset._2_2_ = (uint16_t)uVar7;
  iVar4 = internal::TailCallTableInfo::NumToEntryTable::size16
                    ((NumToEntryTable *)
                     &table_info.aux_entries.
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar7 = AlignTo<google::protobuf::internal::TcParseTableBase::FieldEntry>
                    ((uVar7 & 0xffff) + iVar4 * 2);
  byte_size = uVar7;
  sVar12 = std::
           vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
           ::size((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   *)local_58);
  uVar7 = AlignTo<google::protobuf::internal::TcParseTableBase::FieldAux>(uVar7 + (int)sVar12 * 0xc)
  ;
  p._4_4_ = uVar7;
  sVar12 = std::
           vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
           ::size((vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                   *)&table_info.field_entries.
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &table_info.num_to_entry_table.blocks.
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  p._0_4_ = uVar7 + (int)sVar12 * 8 + (int)sVar13;
  this_00 = (TcParseTableBase *)operator_new((long)(int)p);
  res = this_00;
  bVar2 = internal::ReflectionSchema::HasHasbits(&this->schema_);
  if (bVar2) {
    uVar7 = internal::ReflectionSchema::HasBitsOffset(&this->schema_);
    local_2a8 = (uint16_t)uVar7;
  }
  else {
    local_2a8 = 0;
  }
  bVar2 = internal::ReflectionSchema::HasExtensionSet(&this->schema_);
  if (bVar2) {
    uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    local_2b2 = (uint16_t)uVar7;
  }
  else {
    local_2b2 = 0;
  }
  bVar2 = std::
          vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          ::empty((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   *)local_58);
  if (bVar2) {
    local_2b8 = 0;
  }
  else {
    pvVar14 = std::
              vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
              ::back((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                      *)local_58);
    local_2b8 = FieldDescriptor::number(pvVar14->field);
  }
  lookup_table_offset_00 = aux_offset._2_2_;
  iVar4 = byte_size;
  cVar3 = (char)absl_log_internal_check_op_result * '\b';
  sVar12 = std::
           vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
           ::size((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   *)local_58);
  sVar13 = std::
           vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
           ::size((vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                   *)&table_info.field_entries.
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar7 = p._4_4_;
  iVar5 = (*(((this->schema_).default_instance_)->super_MessageLite)._vptr_MessageLite[4])();
  fallback = GetFastParseFunction(local_140[0]);
  internal::TcParseTableBase::TcParseTableBase
            (this_00,local_2a8,local_2b2,local_2b8,cVar3 + 0xf8,lookup_table_offset_00,
             (uint32_t)
             table_info.aux_entries.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar4,(uint16_t)sVar12,
             (uint16_t)sVar13,uVar7,(ClassData *)CONCAT44(extraout_var,iVar5),(PostLoopHandler)0x0,
             fallback);
  absl_log_internal_check_op_result_1 = (Nullable<const_char_*>)this_00;
  fast_entries = internal::TcParseTableBase::fast_entry(this_00,0);
  PopulateTcParseFastEntries(this,(TailCallTableInfo *)local_140,fast_entries);
  lookup_table = internal::TcParseTableBase::field_lookup_begin
                           ((TcParseTableBase *)absl_log_internal_check_op_result_1);
  PopulateTcParseLookupTable((TailCallTableInfo *)local_140,lookup_table);
  entries = internal::TcParseTableBase::field_entries_begin
                      ((TcParseTableBase *)absl_log_internal_check_op_result_1);
  PopulateTcParseEntries(this,(TailCallTableInfo *)local_140,entries);
  field_aux = internal::TcParseTableBase::field_aux
                        ((TcParseTableBase *)absl_log_internal_check_op_result_1,0);
  PopulateTcParseFieldAux(this,(TailCallTableInfo *)local_140,field_aux);
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &table_info.num_to_entry_table.blocks.
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar2) {
    pcVar10 = internal::TcParseTableBase::name_data
                        ((TcParseTableBase *)absl_log_internal_check_op_result_1);
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &table_info.num_to_entry_table.blocks.
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &table_info.num_to_entry_table.blocks.
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    memcpy(pcVar10,__src,sVar12);
  }
  pcVar10 = internal::TcParseTableBase::name_data
                      ((TcParseTableBase *)absl_log_internal_check_op_result_1);
  sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &table_info.num_to_entry_table.blocks.
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1b0 = absl::lts_20250127::log_internal::GetReferenceableValue
                        ((long)(pcVar10 + (sVar12 - (long)absl_log_internal_check_op_result_1)));
  local_1b4 = absl::lts_20250127::log_internal::GetReferenceableValue((int)p);
  local_1a8 = absl::lts_20250127::log_internal::Check_EQImpl<long,int>
                        (&local_1b0,&local_1b4,
                         "res->name_data() + table_info.field_name_data.size() - reinterpret_cast<char*>(res) == byte_size"
                        );
  pcVar1 = absl_log_internal_check_op_result_1;
  if (local_1a8 != (Nullable<const_char_*>)0x0) {
    pcVar10 = absl::lts_20250127::implicit_cast<char_const*>(local_1a8);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xe82,pcVar10);
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1c8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b5,pLVar11);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_1c8);
  }
  internal::TailCallTableInfo::~TailCallTableInfo((TailCallTableInfo *)local_140);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::~vector((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             *)local_58);
  return (TcParseTableBase *)pcVar1;
}

Assistant:

const internal::TcParseTableBase* Reflection::CreateTcParseTable() const {
  using TcParseTableBase = internal::TcParseTableBase;

  constexpr int kNoHasbit = -1;
  std::vector<internal::TailCallTableInfo::FieldOptions> fields;
  fields.reserve(descriptor_->field_count());
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    auto* field = descriptor_->field(i);
    const bool is_inlined = IsInlined(field);
    fields.push_back({
        field,  //
        static_cast<int>(schema_.HasBitIndex(field)),
        1.f,  // All fields are assumed present.
        GetLazyStyle(field),
        is_inlined,
        // Only LITE can be implicitly weak.
        /* is_implicitly_weak */ false,
        // We could change this to use direct table.
        // Might be easier to do when all messages support TDP.
        /* use_direct_tcparser_table */ false,
        schema_.IsSplit(field),
        is_inlined ? static_cast<int>(schema_.InlinedStringIndex(field))
                   : kNoHasbit,
        field->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
            IsMicroString(field),
    });
  }
  std::sort(fields.begin(), fields.end(), [](const auto& a, const auto& b) {
    return a.field->number() < b.field->number();
  });

  internal::TailCallTableInfo table_info(
      descriptor_,
      {
          /* is_lite */ false,
          /* uses_codegen */ false,
      },
      fields);

  const size_t fast_entries_count = table_info.fast_path_fields.size();
  ABSL_CHECK_EQ(static_cast<int>(fast_entries_count),
                1 << table_info.table_size_log2);
  const uint16_t lookup_table_offset = AlignTo<uint16_t>(
      sizeof(TcParseTableBase) +
      fast_entries_count * sizeof(TcParseTableBase::FastFieldEntry));
  const uint32_t field_entry_offset = AlignTo<TcParseTableBase::FieldEntry>(
      lookup_table_offset +
      sizeof(uint16_t) * table_info.num_to_entry_table.size16());
  const uint32_t aux_offset = AlignTo<TcParseTableBase::FieldAux>(
      field_entry_offset +
      sizeof(TcParseTableBase::FieldEntry) * fields.size());

  int byte_size =
      aux_offset +
      sizeof(TcParseTableBase::FieldAux) * table_info.aux_entries.size() +
      sizeof(char) * table_info.field_name_data.size();

  void* p = ::operator new(byte_size);
  auto* res = ::new (p) TcParseTableBase{
      static_cast<uint16_t>(schema_.HasHasbits() ? schema_.HasBitsOffset() : 0),
      schema_.HasExtensionSet()
          ? static_cast<uint16_t>(schema_.GetExtensionSetOffset())
          : uint16_t{0},
      static_cast<uint32_t>(fields.empty() ? 0 : fields.back().field->number()),
      static_cast<uint8_t>((fast_entries_count - 1) << 3),
      lookup_table_offset,
      table_info.num_to_entry_table.skipmap32,
      field_entry_offset,
      static_cast<uint16_t>(fields.size()),
      static_cast<uint16_t>(table_info.aux_entries.size()),
      aux_offset,
      schema_.default_instance_->GetClassData(),
      nullptr,
      GetFastParseFunction(table_info.fallback_function)
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          ,
      nullptr
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
  };
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
  // We'll prefetch `to_prefetch->to_prefetch` unconditionally to avoid
  // branches. Here we don't know which field is the hottest, so set the pointer
  // to itself to avoid nullptr.
  res->to_prefetch = res;
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE

  // Now copy the rest of the payloads
  PopulateTcParseFastEntries(table_info, res->fast_entry(0));

  PopulateTcParseLookupTable(table_info, res->field_lookup_begin());

  PopulateTcParseEntries(table_info, res->field_entries_begin());

  PopulateTcParseFieldAux(table_info, res->field_aux(0u));

  // Copy the name data.
  if (!table_info.field_name_data.empty()) {
    memcpy(res->name_data(), table_info.field_name_data.data(),
           table_info.field_name_data.size());
  }
  // Validation to make sure we used all the bytes correctly.
  ABSL_CHECK_EQ(res->name_data() + table_info.field_name_data.size() -
                    reinterpret_cast<char*>(res),
                byte_size);

  return res;
}